

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<unsigned_long>::AddAlreadyReserved
          (RepeatedField<unsigned_long> *this,unsigned_long *value)

{
  int iVar1;
  unsigned_long uVar2;
  unsigned_long *puVar3;
  unsigned_long *in_RSI;
  int *in_RDI;
  RepeatedField<unsigned_long> *in_stack_ffffffffffffffe0;
  
  uVar2 = *in_RSI;
  puVar3 = elements(in_stack_ffffffffffffffe0);
  iVar1 = *in_RDI;
  *in_RDI = iVar1 + 1;
  puVar3[iVar1] = uVar2;
  return;
}

Assistant:

inline void RepeatedField<Element>::AddAlreadyReserved(const Element& value) {
  GOOGLE_DCHECK_LT(current_size_, total_size_);
  elements()[current_size_++] = value;
}